

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void BindInstAndMember(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseNodeBin *pPVar4;
  ParseNodeName *this;
  ParseNodeName *right;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode_local;
  
  if (pnode->nop != knopDot) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x8ba,"(pnode->nop == knopDot)","pnode->nop == knopDot");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  BindReference(pnode,byteCodeGenerator);
  pPVar4 = ParseNode::AsParseNodeBin(pnode);
  this = ParseNode::AsParseNodeName(pPVar4->pnode2);
  ByteCodeGenerator::AssignPropertyId(byteCodeGenerator,this->pid);
  this->sym = (Symbol *)0x0;
  ParseNodeName::ClearSymRef(this);
  (this->super_ParseNode).grfpn = (this->super_ParseNode).grfpn | 0x2000;
  return;
}

Assistant:

void BindInstAndMember(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    Assert(pnode->nop == knopDot);

    BindReference(pnode, byteCodeGenerator);

    ParseNodeName *right = pnode->AsParseNodeBin()->pnode2->AsParseNodeName();    
    byteCodeGenerator->AssignPropertyId(right->pid);
    right->sym = nullptr;
    right->ClearSymRef();
    right->grfpn |= fpnMemberReference;
}